

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

string * __thiscall inja::Token::describe_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  Kind KVar1;
  allocator *paVar2;
  char *pcVar3;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  KVar1 = this->kind;
  if (KVar1 == Eof) {
    pcVar3 = "<eof>";
    paVar2 = &local_b;
  }
  else if (KVar1 == LineStatementClose) {
    pcVar3 = "<eol>";
    paVar2 = &local_a;
  }
  else {
    if (KVar1 != Text) {
      nonstd::sv_lite::basic_string_view::operator_cast_to_string
                (__return_storage_ptr__,(basic_string_view *)&this->text);
      return __return_storage_ptr__;
    }
    pcVar3 = "<text>";
    paVar2 = &local_9;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,paVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string describe() const {
		switch (kind) {
			case Kind::Text:
				return "<text>";
			case Kind::LineStatementClose:
				return "<eol>";
			case Kind::Eof:
				return "<eof>";
			default:
				return static_cast<std::string>(text);
		}
	}